

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void __thiscall fmt::v11::basic_specs::set_fill<char>(basic_specs *this,basic_string_view<char> s)

{
  ulong uVar1;
  size_t size;
  ulong uVar2;
  
  uVar2 = s.size_;
  this->data_ = (int)s.size_ << 0xf | this->data_ & 0xfffc7fff;
  if (uVar2 == 1) {
    this->fill_data_[0] = *s.data_;
    this->fill_data_[1] = '\0';
    this->fill_data_[2] = '\0';
    return;
  }
  if (uVar2 < 5) {
    if (uVar2 != 0) {
      uVar1 = 0;
      do {
        this->fill_data_[uVar1] = s.data_[uVar1];
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
    return;
  }
  detail::assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/base.h"
                      ,0x34c,"invalid fill");
}

Assistant:

FMT_CONSTEXPR void set_fill(basic_string_view<Char> s) {
    auto size = s.size();
    set_fill_size(size);
    if (size == 1) {
      unsigned uchar = static_cast<detail::unsigned_char<Char>>(s[0]);
      fill_data_[0] = static_cast<char>(uchar);
      fill_data_[1] = static_cast<char>(uchar >> 8);
      fill_data_[2] = static_cast<char>(uchar >> 16);
      return;
    }
    FMT_ASSERT(size <= max_fill_size, "invalid fill");
    for (size_t i = 0; i < size; ++i)
      fill_data_[i & 3] = static_cast<char>(s[i]);
  }